

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

stbtt_int32 stbtt__GetGlyphClass(stbtt_uint8 *classDefTable,int glyph)

{
  long lVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  uVar3 = *(ushort *)classDefTable << 8 | *(ushort *)classDefTable >> 8;
  uVar2 = 0xffffffff;
  if (uVar3 != 2) {
    if (uVar3 == 1) {
      uVar3 = *(ushort *)(classDefTable + 2) << 8 | *(ushort *)(classDefTable + 2) >> 8;
      if (((int)(uint)uVar3 <= glyph) &&
         ((uint)glyph <
          (uint)(ushort)(*(ushort *)(classDefTable + 4) << 8 | *(ushort *)(classDefTable + 4) >> 8)
          + (uint)uVar3)) {
        lVar5 = (long)(int)((glyph - (uint)uVar3) * 2);
        lVar1 = lVar5 + 6;
        lVar5 = lVar5 + 7;
LAB_00127ebc:
        uVar2 = (uint)CONCAT11(classDefTable[lVar1],classDefTable[lVar5]);
      }
    }
    return uVar2;
  }
  iVar6 = 0;
  uVar2 = (uint)(ushort)(*(ushort *)(classDefTable + 2) << 8 | *(ushort *)(classDefTable + 2) >> 8);
  do {
    uVar4 = uVar2;
    while( true ) {
      if ((int)uVar4 <= iVar6) {
        return -1;
      }
      uVar2 = (int)(iVar6 + (uVar4 - 1)) >> 1;
      lVar5 = (long)(int)(uVar2 * 6);
      if (glyph < (int)(uint)(ushort)(*(ushort *)(classDefTable + lVar5 + 4) << 8 |
                                     *(ushort *)(classDefTable + lVar5 + 4) >> 8)) break;
      if ((uint)glyph <=
          (uint)(ushort)(*(ushort *)(classDefTable + lVar5 + 6) << 8 |
                        *(ushort *)(classDefTable + lVar5 + 6) >> 8)) {
        lVar1 = lVar5 + 8;
        lVar5 = lVar5 + 9;
        goto LAB_00127ebc;
      }
      iVar6 = uVar2 + 1;
    }
  } while( true );
}

Assistant:

static stbtt_int32  stbtt__GetGlyphClass(stbtt_uint8 *classDefTable, int glyph)
{
stbtt_uint16 classDefFormat = ttUSHORT(classDefTable);
switch(classDefFormat)
{
case 1: {
stbtt_uint16 startGlyphID = ttUSHORT(classDefTable + 2);
stbtt_uint16 glyphCount = ttUSHORT(classDefTable + 4);
stbtt_uint8 *classDef1ValueArray = classDefTable + 6;

if (glyph >= startGlyphID && glyph < startGlyphID + glyphCount)
return (stbtt_int32)ttUSHORT(classDef1ValueArray + 2 * (glyph - startGlyphID));

classDefTable = classDef1ValueArray + 2 * glyphCount;
} break;

case 2: {
stbtt_uint16 classRangeCount = ttUSHORT(classDefTable + 2);
stbtt_uint8 *classRangeRecords = classDefTable + 4;

/*  Binary search. */
stbtt_int32 l=0, r=classRangeCount-1, m;
int strawStart, strawEnd, needle=glyph;
while (l <= r) {
stbtt_uint8 *classRangeRecord;
m = (l + r) >> 1;
classRangeRecord = classRangeRecords + 6 * m;
strawStart = ttUSHORT(classRangeRecord);
strawEnd = ttUSHORT(classRangeRecord + 2);
if (needle < strawStart)
r = m - 1;
else if (needle > strawEnd)
l = m + 1;
else
return (stbtt_int32)ttUSHORT(classRangeRecord + 4);
}

classDefTable = classRangeRecords + 6 * classRangeCount;
} break;

default: {
/*  There are no other cases. */
STBTT_assert(0);
} break;
}

return -1;
}